

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool google::protobuf::anon_unknown_26::IsSubSymbol(string_view sub_symbol,string_view super_symbol)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator==(sub_symbol,super_symbol);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = absl::lts_20240722::StartsWith(super_symbol,sub_symbol);
    if (bVar1) {
      bVar2 = super_symbol._M_str[sub_symbol._M_len] == '.';
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool IsSubSymbol(absl::string_view sub_symbol, absl::string_view super_symbol) {
  return sub_symbol == super_symbol ||
         (absl::StartsWith(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}